

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Hashes.cpp
# Opt level: O0

uint64_t aesnihash(uint8_t *in,unsigned_long src_sz)

{
  ulong uVar1;
  ulong *puVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  ulong local_120;
  undefined1 local_108 [16];
  ulong local_d8 [3];
  ulong local_c0;
  ulong *local_b8;
  unsigned_long i;
  __m128i piece;
  __m128i hash;
  __m128i rk1;
  __m128i rk0;
  uint8_t tmp_buf [16];
  unsigned_long src_sz_local;
  uint8_t *in_local;
  
  local_108._8_8_ = 0x646f72616e646f6d;
  local_108._0_8_ = 0x736f6d6570736575;
  local_c0 = src_sz;
  local_b8 = (ulong *)in;
  do {
    if (local_c0 < 0x10) {
      if (local_c0 == 0) {
        auVar5 = vpunpcklqdq_avx(ZEXT816(0),ZEXT816(0));
        auVar5 = aesenc(local_108,auVar5);
        local_108._0_8_ = auVar5._0_8_;
        local_108._8_8_ = auVar5._8_8_;
        return local_108._0_8_ ^ local_108._8_8_;
      }
      for (local_120 = 0; local_120 < local_c0 && local_120 < 0x10; local_120 = local_120 + 1) {
        *(undefined1 *)((long)local_d8 + local_120) = *(undefined1 *)((long)local_b8 + local_120);
      }
      local_c0 = 0x10;
      local_b8 = local_d8;
    }
    uVar1 = *local_b8;
    puVar2 = local_b8 + 1;
    local_b8 = local_b8 + 2;
    local_c0 = local_c0 - 0x10;
    auVar3._8_8_ = local_108._8_8_ ^ *puVar2;
    auVar3._0_8_ = local_108._0_8_ ^ uVar1;
    auVar4._8_8_ = 0x646f72616e646f6d;
    auVar4._0_8_ = 0x736f6d6570736575;
    auVar4 = aesenc(auVar3,auVar4);
    auVar5._8_8_ = 0x126f12321321456d;
    auVar5._0_8_ = 0x1231236570743245;
    local_108 = aesenc(auVar4,auVar5);
  } while( true );
}

Assistant:

uint64_t aesnihash(uint8_t *in, unsigned long src_sz) {
  uint8_t tmp_buf[16] = {0};
  __m128i rk0 = {0x736f6d6570736575ULL, 0x646f72616e646f6dULL};
  __m128i rk1 = {0x1231236570743245ULL, 0x126f12321321456dULL};
  __m128i hash = rk0;

  while (src_sz >= 16) {
  onemoretry:
    __m128i piece = _mm_loadu_si128((__m128i *)in);
    in += 16;
    src_sz -= 16;
    hash = _mm_aesenc_si128(_mm_xor_si128(hash, piece), rk0);
    hash = _mm_aesenc_si128(hash, rk1);
  }

  if (src_sz > 0) {
    unsigned long i;
    for (i = 0; i < src_sz && i < 16; i++) {
      tmp_buf[i] = in[i];
    }
    src_sz = 16;
    in = &tmp_buf[0];
    goto onemoretry;
  }

  hash = _mm_aesenc_si128(hash, _mm_set_epi64x(src_sz, src_sz));

  return hash[0] ^ hash[1];
}